

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O0

double function_norm_C(double *node_values,uint dimension,_func_double_double *function)

{
  double dVar1;
  uint local_2c;
  double dStack_28;
  uint space_step;
  double norm;
  _func_double_double *function_local;
  uint dimension_local;
  double *node_values_local;
  
  if (2 < dimension) {
    dStack_28 = (*function)(node_values[1]);
    dStack_28 = ABS(dStack_28);
    for (local_2c = 2; local_2c + 1 < dimension; local_2c = local_2c + 1) {
      dVar1 = (*function)(node_values[local_2c]);
      dStack_28 = max(ABS(dVar1),dStack_28);
    }
    return dStack_28;
  }
  __assert_fail("dimension >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tenpercent[P]navier-stokes/src/pdesolver/norm.c"
                ,0x2c,"double function_norm_C(const double *, unsigned int, double (*)(double))");
}

Assistant:

double function_norm_C (double const * node_values,
                        unsigned dimension,
                        double (*function) (double)) {

  assert (dimension >= 3);

  double norm = fabs (function (node_values[1]));
  unsigned space_step;
  for (space_step = 2; space_step + 1 < dimension; ++space_step) {
    norm = max (fabs (function (node_values[space_step])), norm);
  }
  return norm;
}